

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

int Bmcs_ManUnfold_rec(Bmcs_Man_t *p,int iObj,int f)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Gia_Obj_t *pGVar5;
  
  pvVar4 = Vec_PtrEntry(&p->vGia2Fr,f);
  iVar2 = *(int *)((long)pvVar4 + (long)iObj * 4);
  if (-1 < iVar2) {
    return iVar2;
  }
  pGVar5 = Gia_ManObj(p->pGia,iObj);
  uVar1 = (uint)*(undefined8 *)pGVar5;
  if ((~uVar1 & 0x9fffffff) == 0) {
    iVar2 = Gia_ObjIsPi(p->pGia,pGVar5);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjCioId(pGVar5);
      Vec_IntPushTwo(&p->vCiMap,iVar2,f);
      iVar2 = Gia_ManAppendCi(p->pFrames);
      goto LAB_00480297;
    }
    if (0 < f) {
      pGVar5 = Gia_ObjRoToRi(p->pGia,pGVar5);
      iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar5);
      iVar2 = Bmcs_ManUnfold_rec(p,iVar2,f + -1);
      iVar2 = Abc_LitNotCond(iVar2,*(uint *)pGVar5 >> 0x1d & 1);
      goto LAB_00480297;
    }
  }
  else {
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x1d0,"int Bmcs_ManUnfold_rec(Bmcs_Man_t *, int, int)");
    }
    iVar2 = Bmcs_ManUnfold_rec(p,iObj - (uVar1 & 0x1fffffff),f);
    iVar2 = Abc_LitNotCond(iVar2,*(uint *)pGVar5 >> 0x1d & 1);
    if (iVar2 != 0) {
      iVar3 = Bmcs_ManUnfold_rec(p,iObj - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff),f);
      iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pGVar5 >> 0x3d) & 1);
      iVar2 = Gia_ManHashAnd(p->pFrames,iVar2,iVar3);
      goto LAB_00480297;
    }
  }
  iVar2 = 0;
LAB_00480297:
  *(int *)((long)pvVar4 + (long)iObj * 4) = iVar2;
  return iVar2;
}

Assistant:

int Bmcs_ManUnfold_rec( Bmcs_Man_t * p, int iObj, int f )
{
    Gia_Obj_t * pObj; 
    int iLit = 0, * pCopies = Bmcs_ManCopies( p, f );
    if ( pCopies[iObj] >= 0 )
        return pCopies[iObj];
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPushTwo( &p->vCiMap, Gia_ObjCioId(pObj), f );
            iLit = Gia_ManAppendCi( p->pFrames );
        }
        else if ( f > 0 )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            iLit = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f-1 );
            iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        }
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        iLit = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId0(pObj, iObj), f );
        iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        if ( iLit > 0 )
        {
            int iNew;
            iNew = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId1(pObj, iObj), f );
            iNew = Abc_LitNotCond( iNew, Gia_ObjFaninC1(pObj) );
            iLit = Gia_ManHashAnd( p->pFrames, iLit, iNew );
        }
    }
    else assert( 0 );
    return (pCopies[iObj] = iLit);
}